

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntFind(Vec_Int_t *p,int Entry)

{
  int local_20;
  int i;
  int Entry_local;
  Vec_Int_t *p_local;
  
  local_20 = 0;
  while( true ) {
    if (p->nSize <= local_20) {
      return -1;
    }
    if (p->pArray[local_20] == Entry) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

static inline int Vec_IntFind( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return i;
    return -1;
}